

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O3

wchar_t create_decode_tables(uint8_t *bit_length,decode_table *table,wchar_t size)

{
  uint16_t *__s;
  bool bVar1;
  wchar_t wVar2;
  uint16_t uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint32_t uVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  wchar_t wVar13;
  uint32_t decode_pos_clone [16];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  int local_68 [16];
  
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  local_68[4] = 0;
  local_68[5] = 0;
  local_68[6] = 0;
  local_68[7] = 0;
  local_68[8] = 0;
  local_68[9] = 0;
  local_68[10] = 0;
  local_68[0xb] = 0;
  local_68[0xc] = 0;
  local_68[0xd] = 0;
  local_68[0xe] = 0;
  local_68[0xf] = 0;
  __s = table->decode_num;
  iVar12 = 0;
  memset(__s,0,0x264);
  table->size = size;
  table->quick_bits = (uint)(size == L'Ĳ') * 3 + 7;
  if (L'\0' < size) {
    uVar4 = 0;
    do {
      local_68[bit_length[uVar4] & 0xf] = local_68[bit_length[uVar4] & 0xf] + 1;
      uVar4 = uVar4 + 1;
    } while ((uint)size != uVar4);
  }
  table->decode_pos[0] = 0;
  table->decode_len[0] = 0;
  lVar7 = 1;
  lVar5 = 0xf;
  uVar9 = 0;
  iVar11 = 0;
  do {
    uVar9 = uVar9 + iVar12;
    iVar12 = local_68[lVar7];
    table->decode_len[lVar7] = iVar11 + iVar12 << ((byte)lVar5 & 0x1f);
    table->decode_pos[lVar7] = uVar9;
    iVar11 = (iVar11 + iVar12) * 2;
    lVar7 = lVar7 + 1;
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  local_78 = *(undefined8 *)(table->decode_pos + 0xc);
  uStack_70 = *(undefined8 *)(table->decode_pos + 0xe);
  local_88 = *(undefined8 *)(table->decode_pos + 8);
  uStack_80 = *(undefined8 *)(table->decode_pos + 10);
  local_98 = *(undefined8 *)(table->decode_pos + 4);
  uStack_90 = *(undefined8 *)(table->decode_pos + 6);
  local_a8 = *(undefined8 *)table->decode_pos;
  uStack_a0 = *(undefined8 *)(table->decode_pos + 2);
  if (L'\0' < size) {
    uVar4 = 0;
    do {
      uVar6 = (ulong)bit_length[uVar4] & 0xf;
      if ((bit_length[uVar4] & 0xf) != 0) {
        iVar12 = *(int *)((long)&local_a8 + uVar6 * 4);
        __s[iVar12] = (uint16_t)uVar4;
        *(int *)((long)&local_a8 + uVar6 * 4) = iVar12 + 1;
      }
      uVar4 = uVar4 + 1;
    } while ((uint)size != uVar4);
  }
  uVar9 = table->quick_bits;
  wVar2 = size;
  if (uVar9 != 0x3f) {
    lVar7 = 1L << ((byte)uVar9 & 0x3f);
    lVar5 = 1;
    wVar2 = L'\x10' - uVar9;
    if (lVar7 < 2) {
      lVar7 = 1;
    }
    lVar10 = 0;
    do {
      iVar12 = (int)lVar10 << ((byte)wVar2 & 0x1f);
      if (lVar5 < 0x10) {
        bVar1 = true;
        if (table->decode_len[lVar5] <= iVar12) {
          do {
            lVar8 = lVar5;
            if (lVar8 == 0xf) {
              lVar5 = 0x10;
              break;
            }
            lVar5 = lVar8 + 1;
          } while (table->decode_len[lVar8 + 1] <= iVar12);
          bVar1 = lVar8 < 0xf;
        }
      }
      else {
        bVar1 = false;
      }
      table->quick_len[lVar10] = (uint8_t)lVar5;
      uVar3 = 0;
      if ((bVar1) &&
         (wVar13 = (iVar12 - table->decode_len[lVar5 + -1] >> (0x10 - (uint8_t)lVar5 & 0x1f)) +
                   table->decode_pos[(uint)lVar5 & 0xf], uVar3 = 0, wVar13 < size)) {
        uVar3 = __s[wVar13];
      }
      table->quick_num[lVar10] = uVar3;
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar7);
  }
  return wVar2;
}

Assistant:

static int create_decode_tables(uint8_t* bit_length,
    struct decode_table* table, int size)
{
	int code, upper_limit = 0, i, lc[16];
	uint32_t decode_pos_clone[rar5_countof(table->decode_pos)];
	ssize_t cur_len, quick_data_size;

	memset(&lc, 0, sizeof(lc));
	memset(table->decode_num, 0, sizeof(table->decode_num));
	table->size = size;
	table->quick_bits = size == HUFF_NC ? 10 : 7;

	for(i = 0; i < size; i++) {
		lc[bit_length[i] & 15]++;
	}

	lc[0] = 0;
	table->decode_pos[0] = 0;
	table->decode_len[0] = 0;

	for(i = 1; i < 16; i++) {
		upper_limit += lc[i];

		table->decode_len[i] = upper_limit << (16 - i);
		table->decode_pos[i] = table->decode_pos[i - 1] + lc[i - 1];

		upper_limit <<= 1;
	}

	memcpy(decode_pos_clone, table->decode_pos, sizeof(decode_pos_clone));

	for(i = 0; i < size; i++) {
		uint8_t clen = bit_length[i] & 15;
		if(clen > 0) {
			int last_pos = decode_pos_clone[clen];
			table->decode_num[last_pos] = i;
			decode_pos_clone[clen]++;
		}
	}

	quick_data_size = (int64_t)1 << table->quick_bits;
	cur_len = 1;
	for(code = 0; code < quick_data_size; code++) {
		int bit_field = code << (16 - table->quick_bits);
		int dist, pos;

		while(cur_len < rar5_countof(table->decode_len) &&
				bit_field >= table->decode_len[cur_len]) {
			cur_len++;
		}

		table->quick_len[code] = (uint8_t) cur_len;

		dist = bit_field - table->decode_len[cur_len - 1];
		dist >>= (16 - cur_len);

		pos = table->decode_pos[cur_len & 15] + dist;
		if(cur_len < rar5_countof(table->decode_pos) && pos < size) {
			table->quick_num[code] = table->decode_num[pos];
		} else {
			table->quick_num[code] = 0;
		}
	}

	return ARCHIVE_OK;
}